

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::
List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::Reset(List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *this)

{
  Type buffer;
  
  buffer = (this->
           super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
           ).buffer;
  if (buffer != (Type)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&((this->
                 super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
                 ).alloc)->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
               buffer,(long)this->length * 0xc);
    (this->
    super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>)
    .buffer = (Type)0x0;
    (this->
    super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>)
    .count = 0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }